

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::
HashMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::Insert(HashMap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         *this,int *key,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 local_48 [8];
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  sVar2 = FindOffset(this,key);
  if (((this->table).ptr[sVar2].set == false) &&
     (sVar3 = this->nStored + 1, this->nStored = sVar3, (this->table).nStored < sVar3 * 3)) {
    Grow(this);
    sVar2 = FindOffset(this,key);
  }
  local_48._0_4_ = *key;
  pcVar1 = (value->_M_dataplus)._M_p;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + value->_M_string_length);
  pstd::
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((this->table).ptr + sVar2,
              (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Grow hash table if it is too full
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }